

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

xmlAutomataStatePtr
xmlAutomataNewCountTrans
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,xmlChar *token,int min,
          int max,void *data)

{
  xmlRegCounter *pxVar1;
  int iVar2;
  xmlRegAtomPtr atom;
  xmlChar *pxVar3;
  
  if ((((min < 0 || token == (xmlChar *)0x0) ||
        (from == (xmlAutomataStatePtr)0x0 || am == (xmlAutomataPtr)0x0)) || (max < 1 || max < min))
     || (atom = xmlRegNewAtom(am,XML_REGEXP_STRING), atom == (xmlRegAtomPtr)0x0)) {
    return (xmlAutomataStatePtr)0x0;
  }
  pxVar3 = xmlStrdup(token);
  atom->valuep = pxVar3;
  atom->data = data;
  iVar2 = 1;
  if (min != 0) {
    iVar2 = min;
  }
  atom->min = iVar2;
  atom->max = max;
  iVar2 = xmlRegGetCounter(am);
  pxVar1 = am->counters;
  pxVar1[iVar2].min = min;
  pxVar1[iVar2].max = max;
  if (to == (xmlAutomataStatePtr)0x0) {
    to = xmlRegNewState(am);
    xmlRegStatePush(am,to);
  }
  xmlRegStateAddTrans(am,from,atom,to,iVar2,-1);
  xmlRegAtomPush(am,atom);
  am->state = to;
  if (to == (xmlRegStatePtr)0x0 || min != 0) {
    return to;
  }
  xmlFAGenerateEpsilonTransition(am,from,to);
  return to;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewCountTrans(xmlAutomataPtr am, xmlAutomataStatePtr from,
			 xmlAutomataStatePtr to, const xmlChar *token,
			 int min, int max, void *data) {
    xmlRegAtomPtr atom;
    int counter;

    if ((am == NULL) || (from == NULL) || (token == NULL))
	return(NULL);
    if (min < 0)
	return(NULL);
    if ((max < min) || (max < 1))
	return(NULL);
    atom = xmlRegNewAtom(am, XML_REGEXP_STRING);
    if (atom == NULL)
	return(NULL);
    atom->valuep = xmlStrdup(token);
    atom->data = data;
    if (min == 0)
	atom->min = 1;
    else
	atom->min = min;
    atom->max = max;

    /*
     * associate a counter to the transition.
     */
    counter = xmlRegGetCounter(am);
    am->counters[counter].min = min;
    am->counters[counter].max = max;

    /* xmlFAGenerateTransitions(am, from, to, atom); */
    if (to == NULL) {
        to = xmlRegNewState(am);
	xmlRegStatePush(am, to);
    }
    xmlRegStateAddTrans(am, from, atom, to, counter, -1);
    xmlRegAtomPush(am, atom);
    am->state = to;

    if (to == NULL)
	to = am->state;
    if (to == NULL)
	return(NULL);
    if (min == 0)
	xmlFAGenerateEpsilonTransition(am, from, to);
    return(to);
}